

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<long_double>::Subst_Forward(TPZMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  int iVar5;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble lVar11;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar12;
  longdouble in_ST7;
  longdouble local_48;
  
  lVar9 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar6 = 0;
  if ((lVar9 == CONCAT44(extraout_var,iVar5)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    iVar6 = 1;
    if (CONCAT44(extraout_var_00,iVar5) != 0 && -1 < extraout_var_00) {
      lVar9 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar9,lVar9);
        lVar11 = in_ST7;
        if (0 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) {
          lVar8 = 0;
          do {
            lVar11 = (longdouble)0;
            lVar10 = in_ST1;
            lVar1 = in_ST2;
            lVar2 = in_ST3;
            lVar3 = in_ST4;
            lVar4 = in_ST5;
            lVar12 = in_ST6;
            if (lVar9 != 0) {
              lVar7 = 0;
              lVar11 = (longdouble)0;
              do {
                lVar10 = in_ST3;
                lVar12 = in_ST7;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar9,lVar7);
                (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(B,lVar7,lVar8);
                lVar11 = lVar11 + in_ST1 * in_ST2;
                lVar7 = lVar7 + 1;
                in_ST1 = lVar10;
                lVar1 = in_ST4;
                in_ST2 = in_ST4;
                lVar2 = in_ST5;
                in_ST3 = in_ST5;
                lVar3 = in_ST6;
                in_ST4 = in_ST6;
                lVar4 = in_ST7;
                in_ST5 = in_ST7;
                in_ST6 = lVar12;
                in_ST7 = lVar12;
              } while (lVar9 != lVar7);
            }
            in_ST6 = in_ST7;
            in_ST5 = lVar12;
            in_ST4 = lVar4;
            in_ST3 = lVar3;
            in_ST2 = lVar2;
            in_ST1 = lVar1;
            (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(B,lVar9,lVar8);
            local_48 = (lVar10 - lVar11) / in_ST0;
            in_ST7 = in_ST6;
            lVar11 = in_ST6;
            (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar9,lVar8,&local_48);
            lVar8 = lVar8 + 1;
          } while (lVar8 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol);
        }
        lVar9 = lVar9 + 1;
        iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        in_ST7 = lVar11;
      } while (lVar9 < CONCAT44(extraout_var_01,iVar5));
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}